

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,DryHandler *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Ch *pCVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  bool bVar20;
  double dVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar24 [16];
  undefined1 in_ZMM3 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  
  pbVar3 = is->src_;
  bVar11 = *pbVar3;
  pbVar9 = pbVar3;
  bVar10 = bVar11;
  if (bVar11 == 0x2d) {
    bVar10 = pbVar3[1];
    pbVar9 = pbVar3 + 1;
  }
  pCVar4 = is->head_;
  if (bVar10 == 0x30) {
    uVar18 = (uint)pbVar9[1];
    pbVar8 = pbVar9 + 1;
    auVar22 = ZEXT1664(ZEXT816(0));
    bVar6 = false;
    uVar16 = 0;
    bVar7 = false;
    iVar12 = 0;
    bVar20 = false;
    uVar14 = 0;
    goto LAB_00101341;
  }
  if ((byte)(bVar10 - 0x31) < 9) {
    bVar2 = pbVar9[1];
    uVar13 = (ulong)bVar2;
    pbVar8 = pbVar9 + 1;
    auVar22 = ZEXT1664(ZEXT816(0));
    uVar14 = bVar10 - 0x30;
    if (bVar11 == 0x2d) {
      if ((byte)(bVar2 - 0x30) < 10) {
        iVar12 = 0;
LAB_001011c5:
        if (uVar14 < 0xccccccc) {
LAB_001011ce:
          iVar12 = iVar12 + 1;
          uVar14 = uVar14 * 10 + -0x30 + (int)uVar13;
          bVar2 = pbVar8[1];
          uVar13 = (ulong)bVar2;
          pbVar8 = pbVar8 + 1;
          if (9 < (byte)(bVar2 - 0x30)) goto LAB_001012a9;
          goto LAB_001011c5;
        }
        if (uVar14 != 0xccccccc) goto LAB_0010124a;
        if ((byte)uVar13 < 0x39) goto LAB_001011ce;
        uVar14 = 0xccccccc;
        uVar13 = 0x39;
LAB_0010124a:
        uVar16 = (ulong)uVar14;
        if (bVar11 == 0x2d) {
          do {
            if ((0xccccccccccccccb < uVar16) && (0x38 < (byte)uVar13 || uVar16 != 0xccccccccccccccc)
               ) goto LAB_001012fc;
            iVar12 = iVar12 + 1;
            uVar15 = uVar13 & 0xf;
            bVar11 = pbVar8[1];
            uVar13 = (ulong)bVar11;
            pbVar8 = pbVar8 + 1;
            uVar16 = uVar15 + uVar16 * 10;
          } while ((byte)(bVar11 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < uVar16) &&
               (0x35 < (byte)uVar13 || uVar16 != 0x1999999999999999)) goto LAB_001012fc;
            iVar12 = iVar12 + 1;
            uVar15 = uVar13 & 0xf;
            bVar11 = pbVar8[1];
            uVar13 = (ulong)bVar11;
            pbVar8 = pbVar8 + 1;
            uVar16 = uVar15 + uVar16 * 10;
          } while ((byte)(bVar11 - 0x30) < 10);
        }
        uVar18 = (uint)bVar11;
        auVar22 = ZEXT1664(ZEXT816(0));
        bVar20 = true;
        bVar6 = false;
        bVar7 = false;
        goto LAB_00101341;
      }
LAB_00101678:
      iVar12 = 0;
    }
    else {
      if (9 < (byte)(bVar2 - 0x30)) goto LAB_00101678;
      iVar12 = 0;
      do {
        if (0x19999998 < uVar14) {
          if (uVar14 != 0x19999999) goto LAB_0010124a;
          if (0x35 < (byte)uVar13) {
            uVar14 = 0x19999999;
            goto LAB_0010124a;
          }
        }
        iVar12 = iVar12 + 1;
        uVar14 = uVar14 * 10 + -0x30 + (int)uVar13;
        bVar2 = pbVar8[1];
        uVar13 = (ulong)bVar2;
        pbVar8 = pbVar8 + 1;
      } while ((byte)(bVar2 - 0x30) < 10);
    }
LAB_001012a9:
    uVar18 = (uint)bVar2;
    uVar16 = 0;
    bVar7 = false;
    bVar6 = false;
    bVar20 = false;
    goto LAB_00101341;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x5fc,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 3;
  pbVar8 = pbVar9;
  goto LAB_0010165f;
LAB_00101510:
  do {
    pbVar9 = pbVar8 + 1;
    pbVar8 = pbVar8 + 1;
  } while ((byte)(*pbVar9 - 0x30) < 10);
LAB_001015b3:
  auVar5._8_8_ = in_XMM4_Qb;
  auVar5._0_8_ = in_XMM4_Qa;
  auVar23 = vcvtusi2sd_avx512f(auVar5,uVar13);
  iVar17 = -iVar12;
  if (!bVar20) {
    iVar17 = iVar12;
  }
  dVar21 = (double)((ulong)bVar7 * (long)dVar21 + (ulong)!bVar7 * auVar23._0_8_);
LAB_001015d7:
  if (bVar6 == false) goto LAB_00101666;
LAB_001015df:
  uVar18 = iVar17 + iVar19;
  if ((int)uVar18 < -0x134) {
    if (uVar18 < 0xfffffd98) goto LAB_00101666;
    dVar21 = (dVar21 / 1e+308) / *(double *)(internal::Pow10(int)::e + (ulong)(-uVar18 - 0x134) * 8)
    ;
  }
  else if ((int)uVar18 < 0) {
    dVar21 = dVar21 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar18 * 8);
  }
  else {
    if (0x134 < uVar18) {
      __assert_fail("n >= 0 && n <= 308",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/internal/pow10.h"
                    ,0x30,"double rapidjson::internal::Pow10(int)");
    }
    dVar21 = dVar21 * *(double *)(internal::Pow10(int)::e + (ulong)uVar18 * 8);
  }
  if (dVar21 <= 1.79769313486232e+308) goto LAB_00101666;
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x6ab,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
LAB_00101655:
  *(undefined4 *)(this + 0x30) = 0xd;
  pbVar9 = pbVar3;
  goto LAB_0010165f;
LAB_001012fc:
  auVar23 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,uVar16);
  auVar22 = ZEXT1664(auVar23);
  do {
    auVar23._0_8_ = (double)((int)uVar13 + -0x30);
    auVar23._8_8_ = in_ZMM3._8_8_;
    bVar11 = pbVar8[1];
    uVar13 = (ulong)bVar11;
    uVar18 = (uint)bVar11;
    pbVar8 = pbVar8 + 1;
    auVar23 = vfmadd132sd_fma(auVar22._0_16_,auVar23,ZEXT816(0x4024000000000000));
    auVar22 = ZEXT1664(auVar23);
  } while ((byte)(bVar11 - 0x30) < 10);
  bVar6 = true;
  bVar7 = true;
  bVar20 = true;
LAB_00101341:
  dVar21 = auVar22._0_8_;
  iVar17 = 0;
  if ((char)uVar18 != '.') {
    iVar19 = 0;
LAB_0010146c:
    bVar6 = bVar7;
    if ((uVar18 | 0x20) != 0x65) goto LAB_001015d7;
    uVar13 = (ulong)uVar14;
    if (bVar20) {
      uVar13 = uVar16;
    }
    bVar6 = true;
    if (bVar7) {
      bVar6 = bVar7;
    }
    bVar11 = pbVar8[1];
    bVar20 = bVar11 != 0x2b;
    if ((bVar20) && (bVar11 != 0x2d)) {
      if (9 < (byte)(bVar11 - 0x30)) {
        pbVar9 = pbVar8 + 1;
LAB_00101527:
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x67c,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xf;
        pbVar8 = pbVar9;
        goto LAB_0010165f;
      }
      iVar12 = bVar11 - 0x30;
      pbVar8 = pbVar8 + 2;
    }
    else {
      pbVar9 = pbVar8 + 2;
      if (9 < (byte)(*pbVar9 - 0x30)) {
        pbVar9 = pbVar8 + 2;
        goto LAB_00101527;
      }
      pbVar8 = pbVar8 + 3;
      iVar12 = *pbVar9 - 0x30;
      if (bVar11 != 0x2b) {
        if (0 < iVar19) {
          __assert_fail("expFrac <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x667,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                       );
        }
        bVar11 = *pbVar8;
        if ((byte)(bVar11 - 0x30) < 10) {
          do {
            iVar12 = iVar12 * 10 + -0x30 + (uint)bVar11;
            if ((iVar19 + 0x7ffffff7) / 10 < iVar12) goto LAB_00101510;
            pbVar8 = pbVar8 + 1;
            bVar11 = *pbVar8;
          } while ((byte)(bVar11 - 0x30) < 10);
        }
        else {
          bVar20 = true;
        }
        goto LAB_001015b3;
      }
    }
    do {
      bVar11 = *pbVar8;
      if (9 < (byte)(bVar11 - 0x30)) {
        bVar20 = false;
        goto LAB_001015b3;
      }
      pbVar8 = pbVar8 + 1;
      iVar12 = iVar12 * 10 + -0x30 + (uint)bVar11;
    } while (iVar12 <= 0x134 - iVar19);
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x677,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    goto LAB_00101655;
  }
  uVar18 = (uint)pbVar8[1];
  pbVar9 = pbVar8 + 1;
  if (0xf5 < (byte)(pbVar8[1] - 0x3a)) {
    iVar19 = 0;
    if (bVar6) {
LAB_001013c9:
      do {
        dVar21 = auVar22._0_8_;
        pbVar8 = pbVar9;
        if (0x39 < (byte)uVar18) goto LAB_0010146c;
        if (iVar12 < 0x11) {
          iVar19 = iVar19 + -1;
          auVar24._0_8_ = (double)(int)(uVar18 - 0x30);
          auVar24._8_8_ = in_XMM4_Qb;
          auVar23 = vfmadd231sd_fma(auVar24,auVar22._0_16_,ZEXT816(0x4024000000000000));
          if (0.0 < auVar23._0_8_) {
            iVar12 = iVar12 + 1;
          }
          auVar22 = ZEXT1664(auVar23);
        }
        dVar21 = auVar22._0_8_;
        pbVar8 = pbVar9 + 1;
        uVar18 = (uint)*pbVar8;
        pbVar9 = pbVar9 + 1;
      } while (0x2f < *pbVar8);
      iVar17 = 0;
      pbVar8 = pbVar9;
      bVar6 = bVar7;
      goto LAB_001015d7;
    }
    if (!bVar20) {
      uVar16 = (ulong)uVar14;
    }
    iVar19 = 0;
    do {
      if ((0x39 < (byte)uVar18) || (uVar16 >> 0x35 != 0)) {
        auVar23 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,uVar16);
        auVar22 = ZEXT1664(auVar23);
        bVar7 = true;
        goto LAB_001013c9;
      }
      iVar19 = iVar19 + -1;
      pbVar8 = pbVar9 + 1;
      uVar16 = (ulong)(uVar18 - 0x30) + uVar16 * 10;
      iVar12 = iVar12 + (uint)(uVar16 != 0);
      pbVar1 = pbVar9 + 1;
      uVar18 = (uint)*pbVar1;
      pbVar9 = pbVar8;
    } while (0x2f < *pbVar1);
    dVar21 = (double)(long)uVar16;
    iVar17 = 0;
    goto LAB_001015df;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x627,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 0xe;
  pbVar8 = pbVar9;
LAB_0010165f:
  *(long *)(this + 0x38) = (long)pbVar9 - (long)pCVar4;
LAB_00101666:
  is->src_ = pbVar8;
  return;
}

Assistant:

~StreamLocalCopy() { original_ = s; }